

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O0

QVersionNumber from_string(QLatin1StringView string,qsizetype *suffixIndex)

{
  int iVar1;
  QVarLengthArray<int,_32LL> *pQVar2;
  const_iterator pvVar3;
  long *in_RCX;
  long lVar4;
  anon_union_8_3_e50c5c22_for_SegmentStorage_0 in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  QSimpleParsedNumber<unsigned_long_long> QVar6;
  char *endOfString;
  char *lastGoodEnd;
  char *start;
  unsigned_long_long value;
  QVarLengthArray<int,_32LL> seg;
  QVarLengthArray<int,_32LL> *in_stack_fffffffffffffea8;
  QVarLengthArray<int,_32LL> *in_stack_fffffffffffffeb0;
  unsigned_long_long in_stack_fffffffffffffec0;
  QSimpleParsedNumber<unsigned_long_long> args;
  qsizetype in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  QVarLengthArray<int,_32LL> *local_100;
  QVarLengthArray<int,_32LL> *local_f8;
  QVarLengthArray<int,_32LL> local_a0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_a0,0xaa,0x98);
  QVarLengthArray<int,_32LL>::QVarLengthArray(&local_a0);
  local_100 = (QVarLengthArray<int,_32LL> *)QLatin1String::begin((QLatin1String *)0x638ab0);
  pQVar2 = (QVarLengthArray<int,_32LL> *)
           QLatin1String::end((QLatin1String *)in_stack_fffffffffffffeb0);
  local_f8 = local_100;
  do {
    QVar6 = qstrntoull(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       (int)((ulong)in_RDI >> 0x20));
    lVar4 = QVar6.used;
    args.used = lVar4;
    args.result = in_stack_fffffffffffffec0;
    if ((lVar4 < 1) ||
       (iVar1 = std::numeric_limits<int>::max(), args = QVar6, (ulong)(long)iVar1 < QVar6.result))
    break;
    QVarLengthArray<int,_32LL>::append(in_stack_fffffffffffffeb0,(int *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffec0 = QVar6.result;
    local_f8 = (QVarLengthArray<int,_32LL> *)
               ((local_f8->super_QVLAStorage<4UL,_4UL,_32LL>).array + lVar4 + -0x17);
    local_100 = (QVarLengthArray<int,_32LL> *)
                (local_f8[-1].super_QVLAStorage<4UL,_4UL,_32LL>.array + 0x7f);
    bVar5 = false;
    if (local_f8 < pQVar2) {
      bVar5 = (char)(local_100->super_QVLABase<int>).super_QVLABaseBase.a == '.';
    }
    args = QVar6;
  } while (bVar5);
  if (in_RCX != (long *)0x0) {
    pvVar3 = QLatin1String::begin((QLatin1String *)0x638c0a);
    *in_RCX = (long)local_100 - (long)pvVar3;
    in_stack_fffffffffffffeb0 = local_100;
  }
  QSpan<const_int,_18446744073709551615UL>::QSpanBase
            ((QSpan<const_int,_18446744073709551615UL> *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  QVersionNumber::QVersionNumber
            ((QVersionNumber *)in_stack_fffffffffffffea8,
             (QSpan<const_int,_18446744073709551615UL>)args);
  QVarLengthArray<int,_32LL>::~QVarLengthArray(in_stack_fffffffffffffeb0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVersionNumber)in_RDI;
}

Assistant:

static QVersionNumber from_string(QLatin1StringView string, qsizetype *suffixIndex)
{
    // 32 should be more than enough, and, crucially, it means we're allocating
    // not more (and often less) often when compared with direct QList usage
    // for all possible segment counts (under the constraint that we don't want
    // to keep more capacity around for the lifetime of the resulting
    // QVersionNumber than required), esp. in the common case where the inline
    // storage can be used.
    QVarLengthArray<int, 32> seg;

    const char *start = string.begin();
    const char *lastGoodEnd = start;
    const char *endOfString = string.end();

    do {
        // parsing as unsigned so a minus sign is rejected
        auto [value, used] = qstrntoull(start, endOfString - start, 10);
        if (used <= 0 || value > qulonglong(std::numeric_limits<int>::max()))
            break;
        seg.append(int(value));
        start += used + 1;
        lastGoodEnd = start - 1;
    } while (start < endOfString && *lastGoodEnd == '.');

    if (suffixIndex)
        *suffixIndex = lastGoodEnd - string.begin();

    return QVersionNumber(seg);
}